

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensor.cpp
# Opt level: O1

Knowledge __thiscall components::Sensor::percept_to_knowledge(Sensor *this,Percepts perceptions)

{
  uint uVar1;
  Knowledge KVar2;
  
  uVar1 = perceptions._0_4_;
  KVar2._0_8_ = (ulong)(uVar1 & 0x100) |
                (ulong)(uVar1 & 0x10000) |
                (ulong)(uVar1 & 0x1000000) |
                (ulong)(uint6)perceptions & 0x100000000 |
                (ulong)((ushort)(perceptions._4_2_ >> 8) & 1) << 0x30 | (ulong)(uVar1 & 1);
  KVar2.pit = false;
  KVar2.gold = false;
  KVar2.ok = false;
  KVar2.visited = false;
  return KVar2;
}

Assistant:

Knowledge Sensor::percept_to_knowledge(Percepts perceptions)
    {
        Knowledge kb;
        kb.stench = perceptions.stench;
        kb.breeze = perceptions.breeze;
        kb.glitter = perceptions.glitter;
        kb.bump = perceptions.bump;
        kb.scream = perceptions.scream;
        kb.wumpus = perceptions.wumpus;
        return kb;
    }